

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer.cpp
# Opt level: O2

shared_ptr<duckdb::CSVBufferHandle,_true> __thiscall
duckdb::CSVBuffer::Pin(CSVBuffer *this,CSVFileHandle *file_handle,bool *has_seeked)

{
  BufferManager *pBVar1;
  BlockHandle *pBVar2;
  undefined1 *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::CSVBufferHandle,_true> sVar3;
  BufferHandle local_48;
  
  pBVar1 = BufferManager::GetBufferManager
                     (*(ClientContext **)
                       ((long)&(file_handle->main_mutex).super___mutex_base._M_mutex + 8));
  if (file_handle->field_0x29 == '\0') {
    pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                       ((shared_ptr<duckdb::BlockHandle,_true> *)&file_handle->encoder);
    if ((pBVar2->state)._M_i == BLOCK_UNLOADED) {
      local_48.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_48.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      shared_ptr<duckdb::BlockHandle,_true>::operator=
                ((shared_ptr<duckdb::BlockHandle,_true> *)&file_handle->encoder,&local_48.handle);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_48.handle.internal.
                  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      Reload((CSVBuffer *)file_handle,(CSVFileHandle *)has_seeked);
      *in_RCX = 1;
    }
  }
  (*pBVar1->_vptr_BufferManager[7])(&local_48,pBVar1,&file_handle->encoder);
  make_shared_ptr<duckdb::CSVBufferHandle,duckdb::BufferHandle,unsigned_long&,unsigned_long&,bool&,unsigned_long&>
            ((BufferHandle *)this,(unsigned_long *)&local_48,
             (unsigned_long *)&(file_handle->main_mutex).super___mutex_base._M_mutex.__data.__kind,
             (bool *)((file_handle->main_mutex).super___mutex_base._M_mutex.__size + 0x18),
             (unsigned_long *)file_handle);
  BufferHandle::~BufferHandle(&local_48);
  sVar3.internal.super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::CSVBufferHandle,_true>)
         sVar3.internal.super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<CSVBufferHandle> CSVBuffer::Pin(CSVFileHandle &file_handle, bool &has_seeked) {
	auto &buffer_manager = BufferManager::GetBufferManager(context);
	if (!is_pipe && block->IsUnloaded()) {
		// We have to reload it from disk
		block = nullptr;
		Reload(file_handle);
		has_seeked = true;
	}
	return make_shared_ptr<CSVBufferHandle>(buffer_manager.Pin(block), actual_buffer_size, requested_size, last_buffer,
	                                        buffer_idx);
}